

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O2

int Test_SUNLinSolSetup(SUNLinearSolver S,SUNMatrix A,int myid)

{
  int iVar1;
  
  iVar1 = SUNLinSolSetup(S,A);
  if (iVar1 == 0) {
    if (myid != 0) {
      return 0;
    }
    puts("    PASSED test -- SUNLinSolSetup ");
    iVar1 = 0;
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSetup check, Proc %d \n",(ulong)(uint)myid);
    iVar1 = 1;
  }
  if (print_time != 0) {
    printf("    SUNLinSolSetup Time: %22.15e \n \n",0);
  }
  return iVar1;
}

Assistant:

int Test_SUNLinSolSetup(SUNLinearSolver S, SUNMatrix A, int myid)
{
  int       failure;
  double    start_time, stop_time;

  start_time = get_time();
  failure = SUNLinSolSetup(S, A);
  stop_time = get_time(); 

  if (failure) {
    printf(">>> FAILED test -- SUNLinSolSetup check, Proc %d \n", myid);
    PRINT_TIME("    SUNLinSolSetup Time: %22.15e \n \n", stop_time - start_time);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNLinSolSetup \n");
    PRINT_TIME("    SUNLinSolSetup Time: %22.15e \n \n", stop_time - start_time);
  }    

  return(0);
}